

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int ncnn::convolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                     int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                     int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  uint extraout_EAX;
  uint uVar7;
  uint extraout_EAX_00;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_101;
  Mat *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  float *local_d8;
  long local_d0;
  int local_c4;
  ulong local_c0;
  Mat *local_b8;
  ulong local_b0;
  ulong local_a8;
  long local_a0;
  void *local_98;
  Mat *local_90;
  long local_88;
  Mat *local_80;
  void *local_78;
  long local_70;
  void *local_68;
  void *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  local_c0 = (ulong)(uint)top_blob->c;
  if (bias_data->data == (void *)0x0) {
    bVar17 = true;
  }
  else {
    bVar17 = (long)bias_data->c * bias_data->cstep == 0;
  }
  iVar2 = bottom_blob->w;
  uVar3 = bottom_blob->c;
  local_e0 = (long)top_blob->w;
  local_b0 = (ulong)(uint)top_blob->h;
  uVar6 = kernel_h * kernel_w;
  local_100 = top_blob;
  local_b8 = bottom_blob;
  local_90 = weight_data;
  local_80 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar6,&local_101);
  uVar7 = extraout_EAX;
  if (0 < kernel_h) {
    iVar9 = 0;
    iVar12 = 0;
    iVar13 = 0;
    do {
      if (0 < kernel_w) {
        lVar15 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar9 + lVar15] = iVar13;
          iVar13 = iVar13 + dilation_w;
          lVar15 = lVar15 + 1;
        } while (kernel_w != (int)lVar15);
        iVar9 = iVar9 + (int)lVar15;
      }
      iVar13 = iVar13 + (iVar2 * dilation_h - dilation_w * kernel_w);
      iVar12 = iVar12 + 1;
      uVar7 = dilation_w;
    } while (iVar12 != kernel_h);
  }
  if (0 < (int)local_c0) {
    local_98 = local_100->data;
    local_a0 = local_100->cstep * local_100->elemsize;
    local_70 = (long)stride_w;
    local_88 = (long)stride_h;
    local_c4 = kernel_h * uVar3 * kernel_w;
    local_f0 = 0;
    uVar16 = (ulong)(activation_type - 1);
    local_f8 = 0;
    lVar15 = local_e0;
    local_a8 = uVar16;
    do {
      if (0 < (int)local_b0) {
        local_100 = (Mat *)(local_a0 * local_f8 + (long)local_98);
        local_68 = (void *)((long)(int)local_f0 * 4 + (long)local_90->data);
        local_e8 = 0;
        do {
          if (0 < (int)lVar15) {
            local_78 = local_80->data;
            sVar4 = local_b8->elemsize;
            sVar5 = local_b8->cstep;
            local_60 = (void *)(local_e8 * local_88 * (long)local_b8->w * sVar4 +
                               (long)local_b8->data);
            local_d8 = (float *)activation_params->data;
            lVar11 = 0;
            do {
              fVar20 = 0.0;
              if (!bVar17) {
                fVar20 = *(float *)((long)local_78 + local_f8 * 4);
              }
              if (0 < (int)uVar3) {
                uVar10 = 0;
                pvVar8 = local_68;
                do {
                  if (0 < (int)uVar6) {
                    uVar14 = 0;
                    do {
                      fVar20 = fVar20 + *(float *)((long)pvVar8 + uVar14 * 4) *
                                        *(float *)((long)local_60 +
                                                  (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar14] *
                                                  4 + sVar5 * sVar4 * uVar10 + lVar11 * local_70 * 4
                                                  );
                      uVar14 = uVar14 + 1;
                    } while (uVar6 != uVar14);
                  }
                  uVar10 = uVar10 + 1;
                  pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar6 * 4);
                } while (uVar10 != uVar3);
              }
              fVar18 = fVar20;
              if ((uint)uVar16 < 6) {
                switch((long)&switchD_0019bbbc::switchdataD_00516890 +
                       (long)(int)(&switchD_0019bbbc::switchdataD_00516890)[uVar16]) {
                case 0x19bbbe:
                  if (fVar20 <= 0.0) {
                    fVar18 = 0.0;
                  }
                  break;
                case 0x19bbce:
                  uStack_54 = 0;
                  uStack_50 = 0;
                  uStack_4c = 0;
                  local_d0 = lVar11;
                  local_58 = fVar20;
                  fVar20 = expf(fVar20);
                  fVar20 = logf(fVar20 + 1.0);
                  fVar20 = tanhf(fVar20);
                  lVar11 = local_d0;
                  lVar15 = local_e0;
                  uVar16 = local_a8;
                  fVar18 = fVar20 * local_58;
                  break;
                case 0x19bc12:
                  if (fVar20 <= *local_d8) {
                    fVar20 = *local_d8;
                  }
                  fVar18 = local_d8[1];
                  if (fVar20 <= local_d8[1]) {
                    fVar18 = fVar20;
                  }
                  break;
                case 0x19bc31:
                  if (88.37626 <= fVar20) {
                    fVar20 = 88.37626;
                  }
                  local_d0 = lVar11;
                  fVar20 = expf((float)(-(uint)(fVar20 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar20 < -88.37626) & (uint)-fVar20));
                  lVar11 = local_d0;
                  lVar15 = local_e0;
                  uVar16 = local_a8;
                  fVar18 = 1.0 / (fVar20 + 1.0);
                  break;
                case 0x19bc8d:
                  fVar18 = (float)(~-(uint)(0.0 < fVar20) & (uint)*local_d8 |
                                  -(uint)(0.0 < fVar20) & 0x3f800000) * fVar20;
                  break;
                case 0x19bcb8:
                  fVar1 = *local_d8;
                  fVar19 = -local_d8[1] / fVar1;
                  fVar18 = 0.0;
                  if ((fVar19 <= fVar20) && (fVar18 = fVar20, fVar20 <= fVar19 + 1.0 / fVar1)) {
                    fVar18 = (fVar1 * fVar20 + local_d8[1]) * fVar20;
                  }
                }
              }
              *(float *)((long)&local_100->data + lVar11 * 4) = fVar18;
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar15);
          }
          local_100 = (Mat *)((long)&local_100->data + lVar15 * 4);
          local_e8 = local_e8 + 1;
        } while (local_e8 != local_b0);
      }
      local_f8 = local_f8 + 1;
      uVar7 = (int)local_f0 + local_c4;
      local_f0 = (ulong)uVar7;
    } while (local_f8 != local_c0);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar7 = extraout_EAX_00;
  }
  return uVar7;
}

Assistant:

static int convolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[space_ofs[k]]; // 20.72
                        float wt = kptr[k];
                        sum += val * wt; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }

            outptr += outw;
        }
    }

    return 0;
}